

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  stbrp_node *psVar1;
  stbrp_node *psVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  stbtt__point sVar5;
  stbtt__point sVar6;
  undefined4 uVar7;
  stbtt_uint8 sVar8;
  byte bVar9;
  undefined4 uVar10;
  ImFontAtlas *pIVar11;
  undefined4 uVar15;
  int *piVar12;
  undefined8 *puVar13;
  ImFont *this;
  long lVar14;
  stbrp_node *psVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [14];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [14];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  unkuint9 Var29;
  undefined1 auVar30 [11];
  undefined1 auVar31 [13];
  undefined1 auVar32 [14];
  unkbyte10 Var33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [16];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  uint6 uVar38;
  ushort uVar39;
  stbtt_uint32 sVar40;
  uint uVar46;
  stbtt__active_edge *z;
  stbtt_uint32 sVar41;
  stbtt_uint32 sVar42;
  stbtt_uint32 sVar43;
  stbtt_uint32 sVar44;
  stbtt_uint32 sVar45;
  value_type *pvVar47;
  stbrp_context *ptr;
  stbrp_node *psVar48;
  long lVar49;
  void *pvVar50;
  void *pvVar51;
  void *__s;
  uchar *puVar52;
  stbtt__point *psVar53;
  stbtt__edge *p_00;
  stbtt__edge *psVar54;
  stbtt__buf *scanline;
  undefined8 *puVar55;
  int *piVar56;
  long *plVar57;
  ImFontGlyph *pIVar58;
  ushort uVar59;
  uint uVar60;
  ImWchar *in_range;
  ImWchar *pIVar61;
  int *piVar62;
  stbtt__buf *psVar63;
  ulong uVar64;
  long lVar65;
  long lVar66;
  float *pfVar67;
  int input_i;
  int iVar68;
  ulong uVar69;
  size_t sz;
  stbtt_uint32 encoding_record;
  int iVar70;
  uint uVar71;
  float fVar72;
  int iVar73;
  int iVar74;
  uchar *puVar75;
  int i;
  stbtt__edge *psVar76;
  ulong uVar77;
  uchar *puVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  byte *pbVar82;
  ImVector<ImFontConfig> *this_00;
  int iVar83;
  void *p;
  int *piVar84;
  uint uVar85;
  long lVar86;
  byte *pbVar87;
  ImWchar c;
  int iVar88;
  long lVar89;
  size_t sz_00;
  stbtt__active_edge *e;
  ulong uVar90;
  stbtt_fontinfo *psVar91;
  float fVar92;
  short *psVar93;
  bool bVar94;
  byte bVar95;
  char cVar97;
  char cVar98;
  float sum;
  char cVar99;
  float fVar96;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar100;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  short sVar103;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  undefined1 in_XMM3 [16];
  float fVar108;
  undefined1 auVar109 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  undefined4 uVar113;
  undefined4 uVar114;
  float fVar115;
  stbtt__buf sVar116;
  stbtt_uint32 charstrings;
  float local_47c;
  ImFontAtlas *local_478;
  float y0_2;
  undefined4 uStack_46c;
  undefined1 local_468 [16];
  stbtt__point *local_458;
  int x0_1;
  stbtt_uint32 fdarrayoff;
  undefined1 local_448 [16];
  undefined8 local_438;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  float *local_420;
  undefined1 local_418 [16];
  stbtt_fontinfo *local_408;
  stbtt_uint32 cstype;
  undefined4 uStack_3fc;
  float local_3f4;
  stbrp_node *local_3f0;
  ulong local_3e8;
  undefined8 *local_3e0;
  int y0;
  ulong local_3d0;
  ImVector<ImFontConfig> *local_3c8;
  float local_3bc;
  ulong local_3b8;
  uchar *local_3b0;
  stbtt_pack_context local_3a8;
  stbtt__point *local_370;
  ulong local_368;
  ulong local_360;
  long local_358;
  long local_350;
  ulong local_348;
  ulong local_340;
  uint local_338;
  uint local_334;
  int local_330;
  int y0_1;
  undefined1 local_328 [16];
  void *local_318;
  void *local_310;
  long local_308;
  void *local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  float local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  value_type *local_2c0;
  long local_2b8;
  long local_2b0;
  ulong local_2a8;
  stbtt__edge *local_2a0;
  ulong local_298;
  ulong local_290;
  size_t local_288;
  size_t local_280;
  uint *local_278;
  int local_270;
  int x1_1;
  ulong local_268;
  undefined8 uStack_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  stbtt__buf b;
  
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                  ,0x690,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  local_3c8 = &atlas->ConfigData;
  ImFontAtlasBuildRegisterDefaultCustomRects(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  local_478 = atlas;
  ImFontAtlas::ClearTexData(atlas);
  iVar70 = 0;
  local_3e8 = 0;
  for (iVar68 = 0; iVar68 < local_3c8->Size; iVar68 = iVar68 + 1) {
    pvVar47 = ImVector<ImFontConfig>::operator[](local_3c8,iVar68);
    pIVar61 = pvVar47->GlyphRanges;
    if (pIVar61 == (ushort *)0x0) {
      pvVar47->GlyphRanges = ImFontAtlas::GetGlyphRangesDefault::ranges;
      pIVar61 = ImFontAtlas::GetGlyphRangesDefault::ranges;
    }
    for (; (*pIVar61 != 0 && (pIVar61[1] != 0)); pIVar61 = pIVar61 + 2) {
      local_3e8 = (ulong)(((int)local_3e8 - (uint)*pIVar61) + (uint)pIVar61[1] + 1);
      iVar70 = iVar70 + 1;
    }
  }
  local_420 = (float *)CONCAT44(local_420._4_4_,iVar70);
  iVar68 = local_478->TexDesiredWidth;
  if (iVar68 < 1) {
    iVar68 = 0x1000;
    iVar70 = (int)local_3e8;
    if ((iVar70 < 0xfa1) && (iVar68 = 0x800, iVar70 < 0x7d1)) {
      iVar68 = (uint)(1000 < iVar70) * 0x200 + 0x200;
    }
  }
  local_478->TexWidth = iVar68;
  local_478->TexHeight = 0;
  uVar71 = local_478->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar70 = iVar68 - uVar71;
  psVar48 = (stbrp_node *)ImGui::MemAlloc((long)iVar70 << 4);
  pIVar11 = local_478;
  if ((ptr == (stbrp_context *)0x0) || (psVar48 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (psVar48 != (stbrp_node *)0x0) {
LAB_00184f0f:
      ImGui::MemFree(psVar48);
    }
    bVar94 = false;
  }
  else {
    local_3a8.user_allocator_context = (void *)0x0;
    local_3a8.height = 0x8000;
    local_3a8.pixels = (uchar *)0x0;
    local_3a8.pack_info = ptr;
    local_3a8.width = iVar68;
    local_3a8.stride_in_bytes = iVar68;
    local_3a8.padding = uVar71;
    local_3a8.nodes = psVar48;
    if (((int)uVar71 < -0x7fff) || (0xffff < iVar70)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_rect_pack.h"
                    ,0x100,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar85 = iVar70 - 1;
    uVar80 = 0;
    psVar16 = psVar48;
    uVar69 = uVar80;
    if (0 < (int)uVar85) {
      uVar80 = (ulong)uVar85;
      uVar69 = uVar80;
    }
    while( true ) {
      bVar94 = uVar80 == 0;
      uVar80 = uVar80 - 1;
      if (bVar94) break;
      psVar16->next = psVar16 + 1;
      psVar16 = psVar16 + 1;
    }
    psVar48[uVar69].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = psVar48;
    ptr->active_head = ptr->extra;
    ptr->width = iVar70;
    ptr->height = 0x8000 - uVar71;
    ptr->num_nodes = iVar70;
    ptr->align = (int)(uVar85 + iVar70) / iVar70;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar70;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
    local_3a8.h_oversample = 1;
    local_3a8.v_oversample = 1;
    ImFontAtlasBuildPackCustomRects(local_478,ptr);
    local_3f0 = (stbrp_node *)ImGui::MemAlloc((long)(pIVar11->ConfigData).Size * 0xc0);
    lVar89 = 0;
    while (lVar89 < local_3c8->Size) {
      pvVar47 = ImVector<ImFontConfig>::operator[](local_3c8,(int)lVar89);
      if ((pvVar47->DstFont == (ImFont *)0x0) ||
         (pIVar11 = pvVar47->DstFont->ContainerAtlas,
         pIVar11 != local_478 && pIVar11 != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                      ,0x6c3,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      psVar48 = (stbrp_node *)pvVar47->FontData;
      iVar68 = pvVar47->FontNo;
      sVar8 = (stbtt_uint8)psVar48->x;
      if (sVar8 == '\0') {
        if (*(stbtt_uint8 *)((long)&psVar48->x + 1) != '\x01') goto LAB_00184ede;
LAB_00184a3d:
        if (((char)psVar48->y != '\0') || (*(char *)((long)&psVar48->y + 1) != '\0'))
        goto LAB_00184ede;
LAB_00184a53:
        sVar45 = -(uint)(iVar68 != 0);
      }
      else {
        if (sVar8 != 't') {
          if (sVar8 != 'O') {
            if ((sVar8 != '1') || (*(stbtt_uint8 *)((long)&psVar48->x + 1) != '\0'))
            goto LAB_00184ede;
            goto LAB_00184a3d;
          }
          if (((*(stbtt_uint8 *)((long)&psVar48->x + 1) != 'T') || ((char)psVar48->y != 'T')) ||
             (*(char *)((long)&psVar48->y + 1) != 'O')) goto LAB_00184ede;
          goto LAB_00184a53;
        }
        sVar8 = *(stbtt_uint8 *)((long)&psVar48->x + 1);
        if (sVar8 == 'r') {
          if (((char)psVar48->y != 'u') || (*(char *)((long)&psVar48->y + 1) != 'e'))
          goto LAB_00184ede;
          goto LAB_00184a53;
        }
        if (sVar8 != 't') {
          if (((sVar8 != 'y') || ((char)psVar48->y != 'p')) ||
             (*(char *)((long)&psVar48->y + 1) != '1')) goto LAB_00184ede;
          goto LAB_00184a53;
        }
        if ((((char)psVar48->y != 'c') || (*(char *)((long)&psVar48->y + 1) != 'f')) ||
           (((sVar45 = ttULONG(&psVar48->field_0x4), sVar45 != 0x20000 && (sVar45 != 0x10000)) ||
            (uVar71 = *(uint *)&psVar48->next,
            (int)(uVar71 >> 0x18 | (uVar71 & 0xff0000) >> 8 | (uVar71 & 0xff00) << 8 |
                 uVar71 << 0x18) <= iVar68)))) goto LAB_00184ede;
        sVar45 = ttULONG((stbtt_uint8 *)((long)&psVar48->next + (long)iVar68 * 4 + 4));
      }
      psVar16 = local_3f0;
      if ((int)sVar45 < 0) {
LAB_00184ede:
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                      ,0x6c6,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      local_448._0_8_ = lVar89;
      local_3f0[lVar89 * 0xc].next = psVar48;
      local_3f0[lVar89 * 0xc + 1].x = (short)sVar45;
      local_3f0[lVar89 * 0xc + 1].y = (short)(sVar45 >> 0x10);
      psVar1 = local_3f0 + lVar89 * 0xc + 4;
      psVar1->x = 0;
      psVar1->y = 0;
      *(undefined4 *)&psVar1->field_0x4 = 0;
      local_3f0[lVar89 * 0xc + 4].next = (stbrp_node *)0x0;
      sVar40 = stbtt__find_table((stbtt_uint8 *)psVar48,sVar45,"cmap");
      sVar41 = stbtt__find_table((stbtt_uint8 *)psVar48,sVar45,"loca");
      local_418._0_4_ = sVar41;
      *(stbtt_uint32 *)&psVar16[lVar89 * 0xc + 1].next = sVar41;
      sVar41 = stbtt__find_table((stbtt_uint8 *)psVar48,sVar45,"head");
      *(stbtt_uint32 *)((long)&psVar16[lVar89 * 0xc + 1].next + 4) = sVar41;
      sVar42 = stbtt__find_table((stbtt_uint8 *)psVar48,sVar45,"glyf");
      local_468._0_4_ = sVar42;
      psVar16[lVar89 * 0xc + 2].x = (short)sVar42;
      psVar16[lVar89 * 0xc + 2].y = (short)(sVar42 >> 0x10);
      sVar42 = stbtt__find_table((stbtt_uint8 *)psVar48,sVar45,"hhea");
      *(stbtt_uint32 *)&psVar16[lVar89 * 0xc + 2].field_0x4 = sVar42;
      sVar43 = stbtt__find_table((stbtt_uint8 *)psVar48,sVar45,"hmtx");
      *(stbtt_uint32 *)&psVar16[lVar89 * 0xc + 2].next = sVar43;
      sVar44 = stbtt__find_table((stbtt_uint8 *)psVar48,sVar45,"kern");
      *(stbtt_uint32 *)((long)&psVar16[lVar89 * 0xc + 2].next + 4) = sVar44;
      local_438 = CONCAT44(local_438._4_4_,sVar45);
      sVar45 = stbtt__find_table((stbtt_uint8 *)psVar48,sVar45,"GPOS");
      psVar16[lVar89 * 0xc + 3].x = (short)sVar45;
      psVar16[lVar89 * 0xc + 3].y = (short)(sVar45 >> 0x10);
      if ((((sVar40 == 0) || (sVar41 == 0)) || (sVar42 == 0)) || (sVar43 == 0)) {
LAB_00184efd:
        local_478->TexWidth = 0;
        local_478->TexHeight = 0;
        psVar48 = local_3f0;
        goto LAB_00184f0f;
      }
      if (local_468._0_4_ == 0) {
        charstrings = 0;
        fdarrayoff = 0;
        cstype = 2;
        x0_1 = 0;
        sVar45 = stbtt__find_table((stbtt_uint8 *)psVar48,(stbtt_uint32)(float)local_438,"CFF ");
        if (sVar45 != 0) {
          psVar1 = psVar16 + lVar89 * 0xc + 4;
          psVar2 = psVar16 + lVar89 * 0xc + 9;
          psVar2->x = 0;
          psVar2->y = 0;
          *(undefined4 *)&psVar2->field_0x4 = 0;
          psVar16[lVar89 * 0xc + 9].next = (stbrp_node *)0x0;
          psVar2 = psVar16 + lVar89 * 0xc + 8;
          psVar2->x = 0;
          psVar2->y = 0;
          *(undefined4 *)&psVar2->field_0x4 = 0;
          psVar16[lVar89 * 0xc + 8].next = (stbrp_node *)0x0;
          *(stbtt_uint8 **)(psVar16 + lVar89 * 0xc + 4) =
               (stbtt_uint8 *)((long)&psVar48->x + (ulong)sVar45);
          psVar16[lVar89 * 0xc + 4].next = (stbrp_node *)0x2000000000000000;
          uVar4._0_2_ = psVar1->x;
          uVar4._2_2_ = psVar1->y;
          uVar4._4_4_ = *(undefined4 *)&psVar1->field_0x4;
          b.data._0_4_ = (int)uVar4;
          b.cursor = (int)psVar16[lVar89 * 0xc + 4].next;
          b.size = (int)((ulong)psVar16[lVar89 * 0xc + 4].next >> 0x20);
          b.data._4_4_ = uVar4._4_4_;
          stbtt__buf_skip(&b,2);
          lVar49 = (long)b.cursor;
          uVar71 = 0;
          if (b.cursor < b.size) {
            b.cursor = b.cursor + 1;
            uVar71 = (uint)*(byte *)(CONCAT44(b.data._4_4_,(int)b.data) + lVar49);
          }
          stbtt__buf_seek(&b,uVar71);
          stbtt__cff_get_index(&b);
          sVar116 = stbtt__cff_get_index(&b);
          _y0 = stbtt__cff_index_get(sVar116,0);
          stbtt__cff_get_index(&b);
          sVar116 = stbtt__cff_get_index(&b);
          *(stbtt__buf *)(psVar16 + lVar89 * 0xc + 6) = sVar116;
          stbtt__dict_get_ints((stbtt__buf *)&y0,0x11,1,&charstrings);
          stbtt__dict_get_ints((stbtt__buf *)&y0,0x106,1,&cstype);
          stbtt__dict_get_ints((stbtt__buf *)&y0,0x124,1,&fdarrayoff);
          stbtt__dict_get_ints((stbtt__buf *)&y0,0x125,1,(stbtt_uint32 *)&x0_1);
          sVar116.data._4_4_ = b.data._4_4_;
          sVar116.data._0_4_ = (int)b.data;
          sVar116.cursor = b.cursor;
          sVar116.size = b.size;
          sVar116 = stbtt__get_subrs(sVar116,_y0);
          iVar68 = x0_1;
          sVar45 = charstrings;
          *(stbtt__buf *)(psVar16 + lVar89 * 0xc + 7) = sVar116;
          if ((cstype == 2) && (charstrings != 0)) {
            if (fdarrayoff != 0) {
              if (x0_1 == 0) goto LAB_00184efd;
              stbtt__buf_seek(&b,fdarrayoff);
              sVar116 = stbtt__cff_get_index(&b);
              *(stbtt__buf *)(psVar16 + lVar89 * 0xc + 8) = sVar116;
              sVar116 = stbtt__buf_range(&b,iVar68,b.size - iVar68);
              *(stbtt__buf *)(psVar16 + lVar89 * 0xc + 9) = sVar116;
            }
            stbtt__buf_seek(&b,sVar45);
            sVar116 = stbtt__cff_get_index(&b);
            *(stbtt__buf *)(psVar16 + lVar89 * 0xc + 5) = sVar116;
            goto LAB_00184d98;
          }
        }
        goto LAB_00184efd;
      }
      if (local_418._0_4_ == 0) goto LAB_00184efd;
LAB_00184d98:
      sVar45 = stbtt__find_table((stbtt_uint8 *)psVar48,(stbtt_uint32)(float)local_438,"maxp");
      if (sVar45 == 0) {
        uVar71 = 0xffff;
      }
      else {
        uVar71 = (uint)(ushort)(*(ushort *)(&psVar48->field_0x4 + sVar45) << 8 |
                               *(ushort *)(&psVar48->field_0x4 + sVar45) >> 8);
      }
      *(uint *)&psVar16[lVar89 * 0xc + 1].field_0x4 = uVar71;
      uVar59 = *(ushort *)((long)&psVar48->y + (ulong)sVar40);
      *(undefined4 *)&psVar16[lVar89 * 0xc + 3].field_0x4 = 0;
      uVar69 = (ulong)(ushort)(uVar59 << 8 | uVar59 >> 8);
      uVar71 = sVar40 + 4;
      iVar68 = 0;
      while (bVar94 = uVar69 != 0, uVar69 = uVar69 - 1, bVar94) {
        uVar80 = (ulong)uVar71;
        uVar59 = *(ushort *)((long)&psVar48->x + uVar80);
        uVar59 = uVar59 << 8 | uVar59 >> 8;
        if ((uVar59 == 0) ||
           ((uVar59 == 3 &&
            ((uVar59 = *(ushort *)((long)&psVar48->y + uVar80), uVar59 = uVar59 << 8 | uVar59 >> 8,
             uVar59 == 10 || (uVar59 == 1)))))) {
          sVar45 = ttULONG(&psVar48->field_0x4 + uVar80);
          iVar68 = sVar45 + sVar40;
          *(int *)&psVar16[lVar89 * 0xc + 3].field_0x4 = iVar68;
        }
        uVar71 = uVar71 + 8;
      }
      if (iVar68 == 0) goto LAB_00184efd;
      uVar59 = *(ushort *)
                ((long)&psVar48[3].y + (long)*(int *)((long)&psVar16[lVar89 * 0xc + 1].next + 4));
      *(uint *)&psVar16[lVar89 * 0xc + 3].next = (uint)(ushort)(uVar59 << 8 | uVar59 >> 8);
      lVar89 = local_448._0_8_ + 1;
    }
    lVar89 = (long)(int)local_3e8;
    sz_00 = lVar89 * 0x1c;
    pvVar50 = ImGui::MemAlloc(sz_00);
    sz = lVar89 << 4;
    pvVar51 = ImGui::MemAlloc(sz);
    lVar89 = (long)(int)local_420;
    __s = ImGui::MemAlloc(lVar89 * 0x28);
    local_300 = pvVar50;
    memset(pvVar50,0,sz_00);
    local_318 = pvVar51;
    memset(pvVar51,0,sz);
    local_310 = __s;
    memset(__s,0,lVar89 * 0x28);
    uVar69 = 0;
    fVar72 = 0.0;
    lVar89 = 0;
    fVar92 = 0.0;
    while (pIVar11 = local_478, lVar89 < local_3c8->Size) {
      pvVar47 = ImVector<ImFontConfig>::operator[](local_3c8,(int)lVar89);
      psVar91 = (stbtt_fontinfo *)(local_3f0 + lVar89 * 0xc);
      pIVar61 = pvVar47->GlyphRanges;
      local_3b8 = 0;
      local_3b0 = (uchar *)0x0;
      while( true ) {
        if ((pIVar61[local_3b8 * 2] == 0) || (pIVar61[local_3b8 * 2 + 1] == 0)) break;
        local_3b0 = (uchar *)(ulong)(((int)local_3b0 - (uint)pIVar61[local_3b8 * 2]) +
                                     (uint)pIVar61[local_3b8 * 2 + 1] + 1);
        local_3b8 = local_3b8 + 1;
      }
      local_348 = uVar69 & 0xffffffff;
      pfVar67 = (float *)(local_348 * 0x28 + (long)local_310);
      *(float **)&psVar91[1].fontstart = pfVar67;
      psVar91[1].loca = (int)local_3b8;
      fVar100 = pvVar47->SizePixels;
      for (uVar69 = 0; local_3b8 != uVar69; uVar69 = uVar69 + 1) {
        *pfVar67 = fVar100;
        uVar59 = pIVar61[uVar69 * 2];
        pfVar67[1] = (float)(uint)uVar59;
        iVar68 = (uint)pIVar61[uVar69 * 2 + 1] - (uint)uVar59;
        pfVar67[4] = (float)(iVar68 + 1);
        *(void **)(pfVar67 + 6) = (void *)((long)(int)fVar92 * 0x1c + (long)local_300);
        fVar92 = (float)(iVar68 + (int)fVar92 + 1);
        pfVar67 = pfVar67 + 10;
      }
      local_3e0 = (undefined8 *)CONCAT44(local_3e0._4_4_,fVar92);
      psVar91[1].userdata = (void *)((long)(int)fVar72 * 0x10 + (long)local_318);
      *(int *)&psVar91[1].data = (int)local_3b0;
      local_47c = fVar72;
      local_350 = lVar89;
      stbtt_PackSetOversampling(&local_3a8,pvVar47->OversampleH,pvVar47->OversampleV);
      uVar4 = local_3a8._32_8_;
      lVar89._0_4_ = psVar91[1].fontstart;
      lVar89._4_4_ = psVar91[1].numGlyphs;
      uVar80 = 0;
      uVar69 = (ulong)(uint)psVar91[1].loca;
      if (psVar91[1].loca < 1) {
        uVar69 = uVar80;
      }
      uVar90 = local_3a8._32_8_ & 0xffffffff;
      local_3f4 = (float)uVar90;
      local_340 = (ulong)local_3a8._32_8_ >> 0x20;
      local_458 = (stbtt__point *)CONCAT44(local_458._4_4_,(float)local_340);
      sVar17 = (short)local_3a8.v_oversample;
      sVar18 = (short)local_3a8.padding;
      _y0_2 = (long)psVar91[1].userdata + 6;
      iVar68 = 0;
      local_328._0_8_ = lVar89;
      while (puVar52 = local_3b0, uVar80 != uVar69) {
        local_448._0_8_ = uVar80;
        fVar92 = *(float *)(lVar89 + uVar80 * 0x28);
        if (fVar92 <= 0.0) {
          uVar113 = 0x80000000;
          uStack_42c = 0x80000000;
          fVar92 = -fVar92 / (float)(ushort)(*(ushort *)(psVar91->data + (long)psVar91->head + 0x12)
                                             << 8 | *(ushort *)
                                                     (psVar91->data + (long)psVar91->head + 0x12) >>
                                                    8);
        }
        else {
          fVar92 = stbtt_ScaleForPixelHeight(psVar91,fVar92);
          uVar113 = extraout_XMM0_Db;
          uStack_42c = extraout_XMM0_Dd;
        }
        lVar89 = uVar80 * 0x28 + lVar89;
        *(char *)(lVar89 + 0x20) = (char)uVar90;
        *(char *)(lVar89 + 0x21) = (char)local_340;
        local_418._0_4_ = iVar68;
        local_468._0_4_ = fVar92 * local_3f4;
        local_438 = CONCAT44(uVar113,fVar92 * local_458._0_4_);
        uStack_430 = 0;
        psVar93 = (short *)((long)iVar68 * 0x10 + _y0_2);
        for (lVar49 = 0; lVar49 < *(int *)(lVar89 + 0x10); lVar49 = lVar49 + 1) {
          if (*(long *)(lVar89 + 8) == 0) {
            iVar68 = *(int *)(lVar89 + 4) + (int)lVar49;
          }
          else {
            iVar68 = *(int *)(*(long *)(lVar89 + 8) + lVar49 * 4);
          }
          iVar68 = stbtt_FindGlyphIndex(psVar91,iVar68);
          stbtt_GetGlyphBitmapBoxSubpixel
                    (psVar91,iVar68,(float)local_468._0_4_,(float)local_438,in_XMM2._0_4_,
                     in_XMM3._0_4_,(int *)&b,&y0,(int *)&cstype,(int *)&charstrings);
          psVar93[-1] = (((short)cstype + (short)uVar4) - (short)(int)b.data) + sVar18 + -1;
          *psVar93 = ~(ushort)y0 + (short)charstrings + sVar17 + sVar18;
          psVar93 = psVar93 + 8;
        }
        iVar68 = local_418._0_4_ + (int)lVar49;
        lVar89 = local_328._0_8_;
        uVar80 = local_448._0_8_ + 1;
      }
      iVar70 = (int)local_3b0;
      if (iVar68 != iVar70) {
        __assert_fail("n == font_glyphs_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                      ,0x6f7,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      uVar69 = local_348 + local_3b8;
      fVar72 = (float)((int)local_47c + iVar70);
      stbrp_pack_rects((stbrp_context *)local_3a8.pack_info,(stbrp_rect *)psVar91[1].userdata,iVar70
                      );
      uVar80 = (ulong)puVar52 & 0xffffffff;
      if (iVar70 < 1) {
        uVar80 = 0;
      }
      for (lVar89 = 0; uVar80 * 0x10 != lVar89; lVar89 = lVar89 + 0x10) {
        pvVar50 = psVar91[1].userdata;
        if (*(int *)((long)pvVar50 + lVar89 + 0xc) != 0) {
          iVar68 = (uint)*(ushort *)((long)pvVar50 + lVar89 + 6) +
                   (uint)*(ushort *)((long)pvVar50 + lVar89 + 10);
          if (iVar68 < local_478->TexHeight) {
            iVar68 = local_478->TexHeight;
          }
          local_478->TexHeight = iVar68;
        }
      }
      fVar92 = local_3e0._0_4_;
      lVar89 = local_350 + 1;
    }
    if (fVar72 != (float)local_3e8) {
      __assert_fail("buf_rects_n == total_glyphs_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                    ,0x6ff,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if (fVar92 != (float)local_3e8) {
      __assert_fail("buf_packedchars_n == total_glyphs_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                    ,0x700,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if ((int)uVar69 != (int)local_420) {
      __assert_fail("buf_ranges_n == total_ranges_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                    ,0x701,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    uVar71 = local_478->TexHeight;
    if ((local_478->Flags & 1) == 0) {
      uVar71 = (int)(uVar71 - 1) >> 1 | uVar71 - 1;
      uVar71 = (int)uVar71 >> 2 | uVar71;
      uVar71 = (int)uVar71 >> 4 | uVar71;
      uVar71 = (int)uVar71 >> 8 | uVar71;
      uVar71 = (int)uVar71 >> 0x10 | uVar71;
    }
    iVar68 = uVar71 + 1;
    local_478->TexHeight = iVar68;
    auVar101._0_4_ = (float)local_478->TexWidth;
    auVar101._4_4_ = (float)iVar68;
    auVar101._8_8_ = 0;
    auVar101 = divps(_DAT_001a5c00,auVar101);
    local_478->TexUvScale = auVar101._0_8_;
    puVar52 = (uchar *)ImGui::MemAlloc((long)(iVar68 * local_478->TexWidth));
    pIVar11->TexPixelsAlpha8 = puVar52;
    memset(puVar52,0,(long)pIVar11->TexHeight * (long)pIVar11->TexWidth);
    local_3a8.pixels = pIVar11->TexPixelsAlpha8;
    local_3a8.height = pIVar11->TexHeight;
    lVar89 = 0;
    while (this_00 = local_3c8, lVar89 < local_3c8->Size) {
      local_2c0 = ImVector<ImFontConfig>::operator[](local_3c8,(int)lVar89);
      psVar16 = local_3f0;
      local_408 = (stbtt_fontinfo *)(local_3f0 + lVar89 * 0xc);
      local_2b8 = lVar89;
      stbtt_PackSetOversampling(&local_3a8,local_2c0->OversampleH,local_2c0->OversampleV);
      psVar48 = psVar16 + lVar89 * 0xc + 10;
      lVar49._0_2_ = psVar48->x;
      lVar49._2_2_ = psVar48->y;
      lVar49._4_4_ = *(undefined4 *)&psVar48->field_0x4;
      psVar48 = psVar16 + lVar89 * 0xc + 0xb;
      local_2b0._0_2_ = psVar48->x;
      local_2b0._2_2_ = psVar48->y;
      local_2b0._4_4_ = *(undefined4 *)&psVar48->field_0x4;
      local_268._0_4_ = local_3a8.h_oversample;
      local_268._4_4_ = local_3a8.v_oversample;
      uStack_260 = 0;
      uVar71 = *(uint *)&psVar16[lVar89 * 0xc + 0xb].next;
      if ((int)*(uint *)&psVar16[lVar89 * 0xc + 0xb].next < 1) {
        uVar71 = 0;
      }
      local_2a8 = (ulong)uVar71;
      lVar89 = 0;
      uVar69 = 0;
      local_308 = lVar49;
      while (lVar86 = local_2b0, uVar69 != local_2a8) {
        fVar92 = *(float *)(local_2b0 + uVar69 * 0x28);
        local_298 = uVar69;
        if (fVar92 <= 0.0) {
          uStack_2d4 = 0x80000000;
          uStack_2d0 = 0x80000000;
          uStack_2cc = 0x80000000;
          local_2d8 = -fVar92 / (float)(ushort)(*(ushort *)
                                                 (local_408->data + (long)local_408->head + 0x12) <<
                                                8 | *(ushort *)
                                                     (local_408->data + (long)local_408->head + 0x12
                                                     ) >> 8);
        }
        else {
          local_2d8 = stbtt_ScaleForPixelHeight(local_408,fVar92);
          uStack_2d4 = extraout_XMM0_Db_00;
          uStack_2d0 = extraout_XMM0_Dc;
          uStack_2cc = extraout_XMM0_Dd_00;
        }
        lVar86 = uVar69 * 0x28 + lVar86;
        uVar69 = *(ulong *)(lVar86 + 0x20);
        auVar19._8_6_ = 0;
        auVar19._0_8_ = uVar69;
        auVar19[0xe] = (char)(uVar69 >> 0x38);
        auVar21._8_4_ = 0;
        auVar21._0_8_ = uVar69;
        auVar21[0xc] = (char)(uVar69 >> 0x30);
        auVar21._13_2_ = auVar19._13_2_;
        auVar22._8_4_ = 0;
        auVar22._0_8_ = uVar69;
        auVar22._12_3_ = auVar21._12_3_;
        auVar23._8_2_ = 0;
        auVar23._0_8_ = uVar69;
        auVar23[10] = (char)(uVar69 >> 0x28);
        auVar23._11_4_ = auVar22._11_4_;
        auVar24._8_2_ = 0;
        auVar24._0_8_ = uVar69;
        auVar24._10_5_ = auVar23._10_5_;
        auVar26[8] = (char)(uVar69 >> 0x20);
        auVar26._0_8_ = uVar69;
        auVar26._9_6_ = auVar24._9_6_;
        auVar28._7_8_ = 0;
        auVar28._0_7_ = auVar26._8_7_;
        cVar99 = (char)(uVar69 >> 0x18);
        Var29 = CONCAT81(SUB158(auVar28 << 0x40,7),cVar99);
        auVar36._9_6_ = 0;
        auVar36._0_9_ = Var29;
        cVar98 = (char)(uVar69 >> 0x10);
        auVar30._1_10_ = SUB1510(auVar36 << 0x30,5);
        auVar30[0] = cVar98;
        auVar37._11_4_ = 0;
        auVar37._0_11_ = auVar30;
        cVar97 = (char)(uVar69 >> 8);
        auVar31._1_12_ = SUB1512(auVar37 << 0x20,3);
        auVar31[0] = cVar97;
        bVar95 = (byte)uVar69;
        uVar59 = CONCAT11(0,bVar95);
        auVar27._2_13_ = auVar31;
        auVar27._0_2_ = uVar59;
        uVar80 = (ulong)uVar59;
        sVar103 = 1 - auVar31._0_2_;
        sVar17 = -auVar30._0_2_;
        uVar39 = (ushort)Var29;
        sVar18 = -uVar39;
        auVar20._10_2_ = 0;
        auVar20._0_10_ = auVar27._0_10_;
        auVar20._12_2_ = uVar39;
        uVar38 = CONCAT42(auVar20._10_4_,auVar30._0_2_);
        auVar32._6_8_ = 0;
        auVar32._0_6_ = uVar38;
        Var33 = CONCAT82(SUB148(auVar32 << 0x40,6),auVar31._0_2_);
        auVar25._4_10_ = Var33;
        auVar25._0_4_ = CONCAT22(0,uVar59);
        local_3a8._32_8_ = auVar25._0_8_;
        auVar104._0_4_ = (float)CONCAT22(0,uVar59);
        uVar71 = (uint)Var33;
        auVar104._4_4_ = (float)uVar71;
        auVar104._8_4_ = (float)(int)uVar38;
        auVar104._12_4_ = (float)uVar39;
        auVar101 = divps(_DAT_001a5c00,auVar104);
        auVar109[0] = -(bVar95 == 0);
        auVar109[1] = -(bVar95 == 0);
        auVar109[2] = -(bVar95 == 0);
        auVar109[3] = -(bVar95 == 0);
        auVar109[4] = -(cVar97 == '\0');
        auVar109[5] = -(cVar97 == '\0');
        auVar109[6] = -(cVar97 == '\0');
        auVar109[7] = -(cVar97 == '\0');
        auVar109[8] = -(cVar98 == '\0');
        auVar109[9] = -(cVar98 == '\0');
        auVar109[10] = -(cVar98 == '\0');
        auVar109[0xb] = -(cVar98 == '\0');
        auVar109[0xc] = -(cVar99 == '\0');
        auVar109[0xd] = -(cVar99 == '\0');
        auVar109[0xe] = -(cVar99 == '\0');
        auVar109[0xf] = -(cVar99 == '\0');
        Var33 = CONCAT64(CONCAT42(CONCAT22(sVar18,sVar18),sVar17),CONCAT22(sVar17,sVar18));
        auVar34._4_8_ = (long)((unkuint10)Var33 >> 0x10);
        auVar34._2_2_ = sVar103;
        auVar34._0_2_ = sVar103;
        auVar102._0_4_ = (float)(int)(short)(1 - uVar59);
        auVar102._4_4_ = (float)(auVar34._0_4_ >> 0x10);
        auVar102._8_4_ = (float)((int)((unkuint10)Var33 >> 0x10) >> 0x10);
        auVar102._12_4_ = (float)(int)sVar18;
        auVar105._0_4_ = auVar104._0_4_ + auVar104._0_4_;
        auVar105._4_4_ = auVar104._4_4_ + auVar104._4_4_;
        auVar105._8_4_ = auVar104._8_4_ + auVar104._8_4_;
        auVar105._12_4_ = auVar104._12_4_ + auVar104._12_4_;
        local_248 = divps(auVar102,auVar105);
        local_248 = ~auVar109 & local_248;
        lVar89 = (long)(int)lVar89;
        uVar69 = (ulong)uVar71;
        lVar65 = 0;
        local_2f8 = lVar86;
        local_258 = auVar101;
LAB_00185593:
        psVar91 = local_408;
        fVar92 = auVar101._0_4_;
        if (lVar65 < *(int *)(lVar86 + 0x10)) {
          if (*(int *)(lVar49 + 0xc + lVar89 * 0x10) != 0) {
            if (*(long *)(lVar86 + 8) == 0) {
              iVar68 = *(int *)(lVar86 + 4) + (int)lVar65;
            }
            else {
              iVar68 = *(int *)(*(long *)(lVar86 + 8) + lVar65 * 4);
            }
            lVar49 = lVar89 * 0x10 + lVar49;
            local_278 = (uint *)(lVar65 * 0x1c + *(long *)(lVar86 + 0x18));
            local_2f0 = lVar65;
            local_2e8 = lVar89;
            iVar70 = stbtt_FindGlyphIndex(local_408,iVar68);
            uVar4 = *(undefined8 *)(lVar49 + 4);
            auVar101 = pshuflw(ZEXT416((uint)local_3a8.padding),ZEXT416((uint)local_3a8.padding),0);
            local_468._4_4_ =
                 CONCAT22((short)((ulong)uVar4 >> 0x30) + auVar101._6_2_,
                          (short)((ulong)uVar4 >> 0x20) + auVar101._4_2_);
            *(ulong *)(lVar49 + 4) =
                 CONCAT44(local_468._4_4_,
                          CONCAT22((short)((ulong)uVar4 >> 0x10) - auVar101._2_2_,
                                   (short)uVar4 - auVar101._0_2_));
            puVar52 = psVar91->data;
            uVar59 = *(ushort *)(puVar52 + (long)psVar91->hhea + 0x22) << 8 |
                     *(ushort *)(puVar52 + (long)psVar91->hhea + 0x22) >> 8;
            iVar68 = psVar91->hmtx;
            lVar89 = (ulong)uVar59 * 4 + (long)iVar68 + -4;
            lVar86 = (ulong)uVar59 * 4 + (long)iVar68 + -3;
            if (iVar70 < (int)(uint)uVar59) {
              lVar89 = (long)(iVar70 * 4) + (long)iVar68;
              lVar86 = (long)(iVar70 * 4) + 1 + (long)iVar68;
            }
            local_334 = (uint)puVar52[lVar89];
            local_338 = (uint)puVar52[lVar86];
            local_468._0_4_ = (float)uVar80 * local_2d8;
            local_468._8_4_ = local_468._4_4_;
            local_468._12_4_ = local_468._4_4_;
            local_448._4_12_ = auVar101._4_12_;
            local_448._0_4_ = (float)uVar69 * local_2d8;
            fVar72 = local_2d8;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar91,iVar70,(float)uVar80 * local_2d8,(float)local_448._0_4_,local_2d8,
                       fVar92,&x0_1,&y0_1,&x1_1,&local_270);
            local_3b0 = local_3a8.pixels + *(ushort *)(lVar49 + 8);
            uVar59 = *(ushort *)(lVar49 + 10);
            local_2e0 = (long)local_3a8.stride_in_bytes;
            iVar68 = (uint)*(ushort *)(lVar49 + 4) - (int)uVar80;
            uVar39 = *(ushort *)(lVar49 + 6);
            local_358 = lVar49;
            uVar71 = stbtt_GetGlyphShape(psVar91,iVar70,(stbtt_vertex **)&cstype);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar91,iVar70,(float)local_468._0_4_,(float)local_448._0_4_,fVar72,fVar92,
                       (int *)&charstrings,(int *)&fdarrayoff,(int *)0x0,(int *)0x0);
            fVar92 = (float)(iVar68 + 1);
            if ((fVar92 != 0.0) && (uVar85 = ((uint)uVar39 - (int)uVar69) + 1, uVar85 != 0)) {
              local_3b0 = local_3b0 + (ulong)uVar59 * local_2e0;
              lVar89 = CONCAT44(uStack_3fc,cstype);
              _y0_2 = CONCAT44(uStack_46c,charstrings);
              local_360 = (ulong)fdarrayoff;
              uVar80 = 0;
              uVar69 = (ulong)uVar71;
              if ((int)uVar71 < 1) {
                uVar69 = uVar80;
              }
              uVar90 = 0;
              for (; uVar69 * 0xe - uVar80 != 0; uVar80 = uVar80 + 0xe) {
                uVar90 = (ulong)((int)uVar90 + (uint)(*(char *)(lVar89 + 0xc + uVar80) == '\x01'));
              }
              local_3bc = fVar92;
              if (((int)uVar90 != 0) &&
                 (local_458 = (stbtt__point *)ImGui::MemAlloc(uVar90 * 4),
                 local_458 != (stbtt__point *)0x0)) {
                local_418._0_8_ = uVar90;
                fVar92 = (float)local_448._0_4_;
                if ((float)local_468._0_4_ <= (float)local_448._0_4_) {
                  fVar92 = (float)local_468._0_4_;
                }
                fVar92 = (0.35 / fVar92) * (0.35 / fVar92);
                psVar53 = (stbtt__point *)0x0;
                iVar88 = 0;
                iVar73 = 0;
                iVar70 = 0;
                local_368 = (ulong)uVar85;
                do {
                  if (iVar73 == 1) {
                    psVar53 = (stbtt__point *)ImGui::MemAlloc((long)iVar70 << 3);
                    if (psVar53 == (stbtt__point *)0x0) {
                      ImGui::MemFree((void *)0x0);
                      psVar53 = local_458;
                      goto LAB_00186536;
                    }
                  }
                  else if (iVar73 == 2) goto LAB_001859f6;
                  local_438 = CONCAT44(local_438._4_4_,iVar73);
                  b.data._0_4_ = 0;
                  fVar72 = 0.0;
                  fVar100 = 0.0;
                  uVar71 = 0xffffffff;
                  for (lVar49 = 0; uVar69 * 0xe - lVar49 != 0; lVar49 = lVar49 + 0xe) {
                    iVar70 = (int)b.data;
                    switch(*(undefined1 *)(lVar89 + 0xc + lVar49)) {
                    case 1:
                      if (-1 < (int)uVar71) {
                        (&local_458->x)[uVar71] = (float)((int)b.data - iVar88);
                      }
                      uVar71 = uVar71 + 1;
                      auVar101 = pshuflw(ZEXT416(*(uint *)(lVar89 + lVar49)),
                                         ZEXT416(*(uint *)(lVar89 + lVar49)),0x60);
                      fVar72 = (float)(auVar101._0_4_ >> 0x10);
                      fVar100 = (float)(auVar101._4_4_ >> 0x10);
                      iVar88 = (int)b.data;
                      iVar70 = (int)b.data + 1;
                      if (psVar53 != (stbtt__point *)0x0) {
                        psVar53[(int)b.data].x = fVar72;
                        psVar53[(int)b.data].y = fVar100;
                      }
                      break;
                    case 2:
                      auVar101 = pshuflw(ZEXT416(*(uint *)(lVar89 + lVar49)),
                                         ZEXT416(*(uint *)(lVar89 + lVar49)),0x60);
                      fVar72 = (float)(auVar101._0_4_ >> 0x10);
                      fVar100 = (float)(auVar101._4_4_ >> 0x10);
                      iVar70 = (int)b.data + 1;
                      if (psVar53 != (stbtt__point *)0x0) {
                        psVar53[(int)b.data].x = fVar72;
                        psVar53[(int)b.data].y = fVar100;
                      }
                      break;
                    case 3:
                      stbtt__tesselate_curve
                                (psVar53,(int *)&b,fVar72,fVar100,
                                 (float)(int)*(short *)(lVar89 + 4 + lVar49),
                                 (float)(int)*(short *)(lVar89 + 6 + lVar49),
                                 (float)(int)*(short *)(lVar89 + lVar49),
                                 (float)(int)*(short *)(lVar89 + 2 + lVar49),fVar92,0);
                      goto LAB_00185982;
                    case 4:
                      stbtt__tesselate_cubic
                                (psVar53,(int *)&b,fVar72,fVar100,
                                 (float)(int)*(short *)(lVar89 + 4 + lVar49),
                                 (float)(int)*(short *)(lVar89 + 6 + lVar49),
                                 (float)(int)*(short *)(lVar89 + 8 + lVar49),
                                 (float)(int)*(short *)(lVar89 + 10 + lVar49),
                                 (float)(int)*(short *)(lVar89 + lVar49),
                                 (float)(int)*(short *)(lVar89 + 2 + lVar49),fVar92,0);
LAB_00185982:
                      auVar101 = pshuflw(ZEXT416(*(uint *)(lVar89 + lVar49)),
                                         ZEXT416(*(uint *)(lVar89 + lVar49)),0x60);
                      fVar72 = (float)(auVar101._0_4_ >> 0x10);
                      fVar100 = (float)(auVar101._4_4_ >> 0x10);
                      iVar70 = (int)b.data;
                    }
                    b.data._0_4_ = iVar70;
                  }
                  (&local_458->x)[(int)uVar71] = (float)((int)b.data - iVar88);
                  iVar73 = (int)(float)local_438 + 1;
                  iVar70 = (int)b.data;
                } while( true );
              }
            }
            goto LAB_0018653b;
          }
          goto LAB_00186ab2;
        }
        uVar69 = local_298 + 1;
      }
      local_3a8.h_oversample = (undefined4)local_268;
      local_3a8.v_oversample = local_268._4_4_;
      fVar92 = local_2c0->RasterizerMultiply;
      if ((fVar92 != 1.0) || (NAN(fVar92))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)&b,fVar92);
        puVar52 = local_3a8.pixels;
        iVar68 = local_3a8.stride_in_bytes;
        pvVar50 = local_408[1].userdata;
        for (pvVar51 = pvVar50;
            pvVar51 != (void *)((long)*(int *)&local_408[1].data * 0x10 + (long)pvVar50);
            pvVar51 = (void *)((long)pvVar51 + 0x10)) {
          if (*(int *)((long)pvVar51 + 0xc) != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)&b,puVar52,(uint)*(ushort *)((long)pvVar51 + 8),
                       (uint)*(ushort *)((long)pvVar51 + 10),(uint)*(ushort *)((long)pvVar51 + 4),
                       (uint)*(ushort *)((long)pvVar51 + 6),iVar68);
            pvVar50 = local_408[1].userdata;
          }
        }
      }
      local_408[1].userdata = (void *)0x0;
      lVar89 = local_2b8 + 1;
    }
    ImGui::MemFree(local_3a8.nodes);
    ImGui::MemFree(local_3a8.pack_info);
    ImGui::MemFree(local_318);
    for (lVar89 = 0; lVar89 < this_00->Size; lVar89 = lVar89 + 1) {
      pvVar47 = ImVector<ImFontConfig>::operator[](this_00,(int)lVar89);
      this = pvVar47->DstFont;
      if (pvVar47->MergeMode == true) {
        ImFont::BuildLookupTable(this);
      }
      psVar91 = (stbtt_fontinfo *)(local_3f0 + lVar89 * 0xc);
      fVar92 = stbtt_ScaleForPixelHeight(psVar91,pvVar47->SizePixels);
      uVar59 = *(ushort *)(psVar91->data + (long)psVar91->hhea + 4);
      uVar39 = *(ushort *)(psVar91->data + (long)psVar91->hhea + 6);
      uVar59 = uVar59 << 8 | uVar59 >> 8;
      fVar72 = -1.0;
      if (0 < (short)uVar59) {
        fVar72 = 1.0;
      }
      uVar39 = uVar39 << 8 | uVar39 >> 8;
      fVar100 = -1.0;
      if (0 < (short)uVar39) {
        fVar100 = 1.0;
      }
      ImFontAtlasBuildSetupFont
                (local_478,this,pvVar47,(float)(int)((float)(int)(short)uVar59 * fVar92 + fVar72),
                 (float)(int)((float)(int)(short)uVar39 * fVar92 + fVar100));
      local_438 = CONCAT44(local_438._4_4_,(pvVar47->GlyphOffset).x);
      local_468 = ZEXT416((uint)((float)(int)(this->Ascent + 0.5) + (pvVar47->GlyphOffset).y));
      local_418._0_8_ = psVar91;
      lVar49 = 0;
      while (lVar49 < psVar91[1].loca) {
        local_448._0_8_ = lVar49;
        lVar86 = lVar49 * 0x28 + *(long *)&psVar91[1].fontstart;
        lVar49 = 0;
        for (lVar65 = 0; lVar65 < *(int *)(lVar86 + 0x10); lVar65 = lVar65 + 1) {
          lVar14 = *(long *)(lVar86 + 0x18);
          uVar59 = *(ushort *)(lVar14 + lVar49);
          if ((((uVar59 != 0) || (*(short *)(lVar14 + 4 + lVar49) != 0)) ||
              (*(short *)(lVar14 + 2 + lVar49) != 0)) || (*(short *)(lVar14 + 6 + lVar49) != 0)) {
            c = (short)*(undefined4 *)(lVar86 + 4) + (short)lVar65;
            lVar66 = lVar14;
            if (pvVar47->MergeMode == true) {
              pIVar58 = ImFont::FindGlyphNoFallback(this,c);
              if (pIVar58 != (ImFontGlyph *)0x0) goto LAB_00186e75;
              lVar66 = *(long *)(lVar86 + 0x18);
              uVar59 = *(ushort *)(lVar66 + lVar49);
            }
            fVar72 = 1.0 / (float)local_478->TexHeight;
            fVar92 = 1.0 / (float)local_478->TexWidth;
            ImFont::AddGlyph(this,c,*(float *)(lVar66 + 8 + lVar49) + 0.0 + (float)local_438,
                             *(float *)(lVar66 + 0xc + lVar49) + 0.0 + (float)local_468._0_4_,
                             *(float *)(lVar66 + 0x14 + lVar49) + 0.0 + (float)local_438,
                             *(float *)(lVar66 + 0x18 + lVar49) + 0.0 + (float)local_468._0_4_,
                             (float)uVar59 * fVar92,(float)*(ushort *)(lVar66 + 2 + lVar49) * fVar72
                             ,(float)*(ushort *)(lVar66 + 4 + lVar49) * fVar92,
                             (float)*(ushort *)(lVar66 + 6 + lVar49) * fVar72,
                             *(float *)(lVar14 + 0x10 + lVar49));
          }
LAB_00186e75:
          lVar49 = lVar49 + 0x1c;
        }
        psVar91 = (stbtt_fontinfo *)local_418._0_8_;
        lVar49 = local_448._0_8_ + 1;
      }
      this_00 = local_3c8;
    }
    ImGui::MemFree(local_300);
    ImGui::MemFree(local_310);
    ImGui::MemFree(local_3f0);
    ImFontAtlasBuildFinish(local_478);
    bVar94 = true;
  }
  return bVar94;
LAB_001859f6:
  if (psVar53 != (stbtt__point *)0x0) {
    iVar70 = 0;
    lVar89 = local_418._0_8_;
    for (lVar49 = 0; local_418._0_8_ != lVar49; lVar49 = lVar49 + 1) {
      iVar70 = iVar70 + (int)(&local_458->x)[lVar49];
    }
    local_370 = psVar53;
    p_00 = (stbtt__edge *)ImGui::MemAlloc((long)(iVar70 + 1) * 0x14);
    if (p_00 != (stbtt__edge *)0x0) {
      iVar70 = 0;
      iVar88 = 0;
      for (lVar49 = 0; lVar49 != lVar89; lVar49 = lVar49 + 1) {
        fVar92 = (&local_458->x)[lVar49];
        uVar80 = (ulong)((int)fVar92 - 1);
        fVar72 = fVar92;
        for (uVar69 = 0; iVar73 = (int)uVar80, (long)uVar69 < (long)(int)fVar72; uVar69 = uVar69 + 1
            ) {
          fVar100 = local_370[(long)iVar70 + (long)iVar73].y;
          fVar96 = local_370[(long)iVar70 + uVar69].y;
          if ((fVar100 != fVar96) || (NAN(fVar100) || NAN(fVar96))) {
            iVar83 = (int)uVar69;
            iVar74 = iVar73;
            if (fVar100 <= fVar96) {
              iVar74 = iVar83;
              iVar83 = iVar73;
            }
            p_00[iVar88].invert = (uint)(fVar96 < fVar100);
            sVar5 = local_370[(long)iVar70 + (long)iVar74];
            sVar6 = local_370[(long)iVar70 + (long)iVar83];
            psVar54 = p_00 + iVar88;
            psVar54->x0 = sVar5.x * (float)local_468._0_4_ + 0.0;
            psVar54->y0 = sVar5.y * -(float)local_448._0_4_ + 0.0;
            psVar54->x1 = sVar6.x * (float)local_468._0_4_ + 0.0;
            psVar54->y1 = sVar6.y * -(float)local_448._0_4_ + 0.0;
            iVar88 = iVar88 + 1;
            fVar72 = (&local_458->x)[lVar49];
          }
          uVar80 = uVar69 & 0xffffffff;
        }
        iVar70 = (int)fVar92 + iVar70;
        lVar89 = local_418._0_8_;
      }
      stbtt__sort_edges_quicksort(p_00,iVar88);
      fVar92 = local_3bc;
      psVar54 = p_00;
      for (uVar69 = 1; (long)uVar69 < (long)iVar88; uVar69 = uVar69 + 1) {
        uVar3 = p_00[uVar69].x0;
        uVar7 = p_00[uVar69].y0;
        b.cursor = p_00[uVar69].invert;
        uVar10 = p_00[uVar69].x1;
        uVar15 = p_00[uVar69].y1;
        psVar76 = psVar54;
        for (uVar80 = uVar69; 0 < (long)uVar80; uVar80 = uVar80 - 1) {
          if (psVar76->y0 <= (float)uVar7) goto LAB_00185bb2;
          psVar76[1].invert = psVar76->invert;
          fVar72 = psVar76->y0;
          fVar100 = psVar76->x1;
          fVar96 = psVar76->y1;
          psVar76[1].x0 = psVar76->x0;
          psVar76[1].y0 = fVar72;
          psVar76[1].x1 = fVar100;
          psVar76[1].y1 = fVar96;
          psVar76 = psVar76 + -1;
        }
        uVar80 = 0;
LAB_00185bb2:
        iVar70 = (int)uVar80;
        if (uVar69 != (uVar80 & 0xffffffff)) {
          p_00[iVar70].x0 = (float)uVar3;
          p_00[iVar70].y0 = (float)uVar7;
          p_00[iVar70].x1 = (float)uVar10;
          p_00[iVar70].y1 = (float)uVar15;
          p_00[iVar70].invert = b.cursor;
        }
        psVar54 = psVar54 + 1;
        b.data._0_4_ = uVar10;
        b.data._4_4_ = uVar15;
      }
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_3d0;
      _y0 = (stbtt__buf)(auVar35 << 0x40);
      scanline = &b;
      if (0x40 < (int)local_3bc) {
        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)(uint)local_3bc * 8 + 4);
      }
      iVar70 = (int)local_368;
      local_348 = (ulong)(int)fVar92;
      local_420 = (float *)((long)&scanline->data + local_348 * 4);
      p_00[iVar88].y0 = (float)((int)local_360 + iVar70) + 1.0;
      local_350 = CONCAT44(local_350._4_4_,(float)(int)y0_2);
      local_280 = local_348 * 4;
      local_288 = (long)(iVar68 + 2) << 2;
      local_47c = (float)(int)fVar92;
      local_3f4 = 0.0;
      if (0 < (int)fVar92) {
        local_3f4 = fVar92;
      }
      local_290 = 0;
      if (0 < (long)local_348) {
        local_290 = local_348;
      }
      local_3e8 = 0;
      local_368 = local_368 & 0xffffffff;
      if (iVar70 < 1) {
        local_368 = 0;
      }
      piVar84 = (int *)0x0;
      local_3b8 = local_3b8 & 0xffffffff00000000;
      local_3e0 = (undefined8 *)0x0;
      iVar68 = 0;
      uVar69 = local_360;
      local_2a0 = p_00;
      while (psVar54 = local_2a0, puVar55 = local_3e0, iVar68 != (int)local_368) {
        _y0_2 = CONCAT44(uStack_46c,(float)(int)uVar69);
        fVar92 = (float)(int)uVar69 + 1.0;
        local_360 = uVar69;
        local_330 = iVar68;
        memset(scanline,0,local_280);
        memset(local_420,0,local_288);
        piVar56 = &y0;
        while (piVar62 = piVar56, piVar12 = *(int **)piVar62, fVar72 = y0_2, piVar12 != (int *)0x0)
        {
          piVar56 = piVar12;
          if ((float)piVar12[7] <= y0_2) {
            *(undefined8 *)piVar62 = *(undefined8 *)piVar12;
            if (((float)piVar12[5] == 0.0) && (!NAN((float)piVar12[5]))) {
              __assert_fail("z->direction",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                            ,0xc4f,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            piVar12[5] = 0;
            *(int **)piVar12 = piVar84;
            piVar56 = piVar62;
            piVar84 = piVar12;
          }
        }
        for (; fVar100 = p_00->y0, fVar100 <= fVar92; p_00 = p_00 + 1) {
          fVar96 = p_00->y1;
          if ((fVar100 != fVar96) || (piVar56 = piVar84, NAN(fVar100) || NAN(fVar96))) {
            if (piVar84 == (int *)0x0) {
              if ((int)local_3b8 == 0) {
                puVar55 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar55 == (undefined8 *)0x0) {
                  __assert_fail("z != __null",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                                ,0xabf,
                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                               );
                }
                *puVar55 = local_3e0;
                fVar100 = p_00->y0;
                fVar96 = p_00->y1;
                iVar68 = 799;
                fVar72 = y0_2;
              }
              else {
                iVar68 = (int)local_3b8 + -1;
                puVar55 = local_3e0;
              }
              local_3b8 = CONCAT44(local_3b8._4_4_,iVar68);
              piVar84 = (int *)(puVar55 + (long)iVar68 * 4 + 1);
              piVar56 = (int *)0x0;
              local_3e0 = puVar55;
            }
            else {
              piVar56 = *(int **)piVar84;
            }
            fVar107 = p_00->x0;
            fVar115 = (p_00->x1 - fVar107) / (fVar96 - fVar100);
            piVar84[3] = (int)fVar115;
            piVar84[4] = -(uint)(fVar115 != 0.0) & (uint)(1.0 / fVar115);
            piVar84[2] = (int)(((fVar72 - fVar100) * fVar115 + fVar107) - (float)local_350);
            piVar84[5] = *(int *)(&DAT_001b18d0 + (ulong)(p_00->invert == 0) * 4);
            piVar84[6] = (int)fVar100;
            piVar84[7] = (int)fVar96;
            piVar84[0] = 0;
            piVar84[1] = 0;
            if (fVar96 < fVar72) {
              __assert_fail("z->ey >= scan_y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                            ,0xc5c,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            *(stbtt__active_edge **)piVar84 = _y0;
            _y0 = (stbtt__active_edge *)piVar84;
          }
          piVar84 = piVar56;
        }
        e = _y0;
        if (_y0 != (stbtt__active_edge *)0x0) {
          for (; e != (stbtt__active_edge *)0x0; e = e->next) {
            fVar100 = e->ey;
            if (fVar100 < fVar72) {
              __assert_fail("e->ey >= y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                            ,0xb93,
                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                           );
            }
            fVar96 = e->fx;
            fVar107 = e->fdx;
            if ((fVar107 != 0.0) || (NAN(fVar107))) {
              fVar115 = e->sy;
              if (fVar92 < fVar115) {
                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                              ,0xba6,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar112 = fVar107 + fVar96;
              fVar110 = (float)(~-(uint)(fVar72 < fVar115) & (uint)fVar96 |
                               (uint)((fVar115 - fVar72) * fVar107 + fVar96) &
                               -(uint)(fVar72 < fVar115));
              if ((((fVar110 < 0.0) ||
                   (fVar111 = (float)(~-(uint)(fVar100 < fVar92) & (uint)fVar112 |
                                     (uint)((fVar100 - fVar72) * fVar107 + fVar96) &
                                     -(uint)(fVar100 < fVar92)), fVar111 < 0.0)) ||
                  (local_47c <= fVar110)) || (local_47c <= fVar111)) {
                local_328 = ZEXT416((uint)fVar96);
                local_418 = ZEXT416((uint)fVar112);
                local_340 = CONCAT44(local_340._4_4_,fVar107);
                uVar113 = 0;
                uVar114 = 0;
                fVar100 = 0.0;
                while (local_3f4 != fVar100) {
                  fVar110 = (float)(int)fVar100;
                  fVar115 = (float)((int)fVar100 + 1);
                  fVar111 = (fVar110 - fVar96) / fVar107 + fVar72;
                  fVar107 = (fVar115 - fVar96) / fVar107 + fVar72;
                  local_438 = CONCAT44(local_438._4_4_,fVar110);
                  if ((fVar110 <= fVar96) || (fVar112 <= fVar115)) {
                    if ((fVar110 <= fVar112) || (fVar96 <= fVar115)) {
                      if (((fVar110 <= fVar96) || (fVar112 <= fVar110)) &&
                         ((fVar110 <= fVar112 || (fVar96 <= fVar110)))) {
                        if (((fVar96 < fVar115) && (fVar115 < fVar112)) ||
                           ((fVar112 < fVar115 && (fVar115 < fVar96)))) {
                          local_468._0_4_ = fVar115;
                          local_448._0_4_ = fVar107;
                          goto LAB_0018612a;
                        }
                        auVar106._4_4_ = 0;
                        auVar106._0_4_ = fVar112;
                        auVar106._8_4_ = uVar113;
                        auVar106._12_4_ = uVar114;
                        fVar111 = fVar72;
                        goto LAB_001861d9;
                      }
                    }
                    else {
                      local_468._0_4_ = fVar115;
                      local_448._0_4_ = fVar107;
                      stbtt__handle_clipped_edge
                                ((float *)scanline,(int)fVar100,e,fVar96,fVar72,fVar115,fVar107);
                      fVar96 = (float)local_468._0_4_;
                      fVar110 = (float)local_438;
                      fVar72 = (float)local_448._0_4_;
                    }
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar100,e,fVar96,fVar72,fVar110,fVar111);
                    auVar106 = local_418;
                    fVar96 = (float)local_438;
                  }
                  else {
                    local_468._0_4_ = fVar115;
                    local_448._0_4_ = fVar107;
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar100,e,fVar96,fVar72,fVar110,fVar111);
                    fVar96 = (float)local_438;
                    fVar115 = (float)local_468._0_4_;
                    fVar107 = (float)local_448._0_4_;
                    fVar72 = fVar111;
LAB_0018612a:
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar100,e,fVar96,fVar72,fVar115,fVar107);
                    auVar106 = local_418;
                    fVar96 = (float)local_468._0_4_;
                    fVar111 = (float)local_448._0_4_;
                  }
LAB_001861d9:
                  stbtt__handle_clipped_edge
                            ((float *)scanline,(int)fVar100,e,fVar96,fVar111,auVar106._0_4_,fVar92);
                  fVar96 = (float)local_328._0_4_;
                  fVar112 = (float)local_418._0_4_;
                  uVar113 = local_418._8_4_;
                  uVar114 = local_418._12_4_;
                  fVar107 = (float)local_340;
                  fVar100 = (float)((int)fVar100 + 1);
                  fVar72 = y0_2;
                }
              }
              else {
                if (fVar115 <= fVar72) {
                  fVar115 = fVar72;
                }
                uVar71 = (uint)fVar110;
                if (fVar92 <= fVar100) {
                  fVar100 = fVar92;
                }
                uVar85 = (uint)fVar111;
                if (uVar71 == uVar85) {
                  if (((int)uVar71 < 0) || ((int)local_3bc <= (int)uVar71)) {
                    __assert_fail("x >= 0 && x < len",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                                  ,0xbc2,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  uVar69 = (ulong)uVar71;
                  *(float *)((long)&scanline->data + uVar69 * 4) =
                       (((fVar111 - (float)(int)uVar71) + (fVar110 - (float)(int)uVar71)) * -0.5 +
                       1.0) * e->direction * (fVar100 - fVar115) +
                       *(float *)((long)&scanline->data + uVar69 * 4);
                  fVar96 = (fVar100 - fVar115) * e->direction;
                }
                else {
                  fVar107 = e->fdy;
                  uVar46 = uVar71;
                  fVar108 = fVar110;
                  if (fVar111 < fVar110) {
                    fVar108 = fVar72 - fVar115;
                    fVar115 = (fVar72 - fVar100) + fVar92;
                    fVar107 = -fVar107;
                    fVar96 = fVar112;
                    uVar46 = uVar85;
                    uVar85 = uVar71;
                    fVar100 = fVar108 + fVar92;
                    fVar108 = fVar111;
                    fVar111 = fVar110;
                  }
                  iVar68 = uVar46 + 1;
                  fVar112 = ((float)iVar68 - fVar96) * fVar107 + fVar72;
                  fVar96 = e->direction;
                  fVar110 = (fVar112 - fVar115) * fVar96;
                  *(float *)((long)&scanline->data + (long)(int)uVar46 * 4) =
                       (1.0 - ((fVar108 - (float)(int)uVar46) + 1.0) * 0.5) * fVar110 +
                       *(float *)((long)&scanline->data + (long)(int)uVar46 * 4);
                  uVar69 = (ulong)(int)uVar85;
                  for (lVar89 = (long)iVar68; lVar89 < (long)uVar69; lVar89 = lVar89 + 1) {
                    *(float *)((long)&scanline->data + lVar89 * 4) =
                         fVar107 * fVar96 * 0.5 + fVar110 +
                         *(float *)((long)&scanline->data + lVar89 * 4);
                    fVar110 = fVar110 + fVar107 * fVar96;
                  }
                  if (1.01 < ABS(fVar110)) {
                    __assert_fail("fabs(area) <= 1.01f",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                                  ,0xbe7,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  *(float *)((long)&scanline->data + uVar69 * 4) =
                       (fVar100 - (fVar107 * (float)(int)(uVar85 - iVar68) + fVar112)) *
                       (((fVar111 - (float)(int)uVar85) + 0.0) * -0.5 + 1.0) * fVar96 + fVar110 +
                       *(float *)((long)&scanline->data + uVar69 * 4);
                  fVar96 = (fVar100 - fVar115) * fVar96;
                }
                local_420[uVar69 + 1] = fVar96 + local_420[uVar69 + 1];
              }
            }
            else if (fVar96 < local_47c) {
              if (0.0 <= fVar96) {
                local_328 = ZEXT416((uint)fVar96);
                stbtt__handle_clipped_edge
                          ((float *)scanline,(int)fVar96,e,fVar96,fVar72,fVar96,fVar92);
                iVar68 = (int)fVar96 + 1;
                auVar101 = local_328;
                fVar72 = y0_2;
              }
              else {
                iVar68 = 0;
                auVar101 = ZEXT416((uint)fVar96);
              }
              stbtt__handle_clipped_edge
                        (local_420,iVar68,e,auVar101._0_4_,fVar72,auVar101._0_4_,fVar92);
              fVar72 = y0_2;
            }
          }
        }
        fVar92 = 0.0;
        uVar69 = local_290;
        psVar63 = scanline;
        uVar80 = local_3e8;
        while (bVar94 = uVar69 != 0, uVar69 = uVar69 - 1, bVar94) {
          fVar92 = fVar92 + *(float *)((long)&psVar63->data + local_348 * 4);
          iVar68 = (int)(ABS(*(float *)&psVar63->data + fVar92) * 255.0 + 0.5);
          if (0xfe < iVar68) {
            iVar68 = 0xff;
          }
          local_3b0[(int)uVar80] = (uchar)iVar68;
          uVar80 = (ulong)((int)uVar80 + 1);
          psVar63 = (stbtt__buf *)((long)&psVar63->data + 4);
        }
        plVar57 = (long *)&y0;
        while (plVar57 = (long *)*plVar57, plVar57 != (long *)0x0) {
          *(float *)(plVar57 + 1) = *(float *)((long)plVar57 + 0xc) + *(float *)(plVar57 + 1);
        }
        uVar69 = (ulong)((int)local_360 + 1);
        local_3e8 = (ulong)(uint)((int)local_3e8 + (int)local_2e0);
        iVar68 = local_330 + 1;
      }
      while (puVar55 != (undefined8 *)0x0) {
        puVar13 = (undefined8 *)*puVar55;
        ImGui::MemFree(puVar55);
        puVar55 = puVar13;
      }
      if (scanline != &b) {
        ImGui::MemFree(scanline);
      }
      ImGui::MemFree(psVar54);
    }
    ImGui::MemFree(local_458);
    psVar53 = local_370;
LAB_00186536:
    ImGui::MemFree(psVar53);
  }
LAB_0018653b:
  ImGui::MemFree((void *)CONCAT44(uStack_3fc,cstype));
  uVar46 = local_3a8.h_oversample;
  uVar80 = local_3a8._32_8_ & 0xffffffff;
  uVar71 = *(uint *)(local_358 + 8);
  uVar85 = *(uint *)(local_358 + 4);
  if (1 < uVar80) {
    local_438 = (long)local_3a8.stride_in_bytes;
    lVar89 = (long)(int)((uVar71 >> 0x10) * local_3a8.stride_in_bytes);
    puVar52 = local_3a8.pixels + lVar89 + (ulong)(ushort)uVar71;
    iVar68 = (uVar85 & 0xffff) - local_3a8.h_oversample;
    b.data._0_4_ = 0;
    b.data._4_4_ = 0;
    if (iVar68 < 0) {
      iVar68 = -1;
    }
    uVar69 = (long)iVar68 + 1;
    puVar75 = local_3a8.pixels + lVar89 + (ulong)(ushort)uVar71 + (long)iVar68 + 1;
    for (uVar71 = 0; uVar71 != uVar85 >> 0x10; uVar71 = uVar71 + 1) {
      memset(&b,0,uVar80);
      puVar78 = puVar75;
      uVar90 = uVar69;
      switch(uVar46) {
      case 2:
        uVar64 = 0;
        for (uVar77 = 0; uVar69 != uVar77; uVar77 = uVar77 + 1) {
          bVar95 = puVar52[uVar77];
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar77 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar77 + 2 & 7)) = bVar95;
          uVar60 = (int)uVar64 + ((uint)bVar95 - (uint)bVar9);
          uVar64 = (ulong)uVar60;
          puVar52[uVar77] = (uchar)(uVar60 >> 1);
        }
        break;
      case 3:
        uVar64 = 0;
        for (uVar77 = 0; uVar69 != uVar77; uVar77 = uVar77 + 1) {
          bVar95 = puVar52[uVar77];
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar77 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar77 + 3 & 7)) = bVar95;
          uVar64 = (ulong)((int)uVar64 + ((uint)bVar95 - (uint)bVar9));
          puVar52[uVar77] = (uchar)(uVar64 / 3);
        }
        break;
      case 4:
        uVar64 = 0;
        for (uVar77 = 0; uVar69 != uVar77; uVar77 = uVar77 + 1) {
          bVar95 = puVar52[uVar77];
          uVar79 = (ulong)((uint)uVar77 & 7);
          bVar9 = *(byte *)((long)&b.data + uVar79);
          *(byte *)((long)&b.data + (uVar79 ^ 4)) = bVar95;
          uVar60 = (int)uVar64 + ((uint)bVar95 - (uint)bVar9);
          uVar64 = (ulong)uVar60;
          puVar52[uVar77] = (uchar)(uVar60 >> 2);
        }
        break;
      case 5:
        uVar64 = 0;
        for (uVar77 = 0; uVar69 != uVar77; uVar77 = uVar77 + 1) {
          bVar95 = puVar52[uVar77];
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar77 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar77 + 5 & 7)) = bVar95;
          uVar64 = (ulong)((int)uVar64 + ((uint)bVar95 - (uint)bVar9));
          puVar52[uVar77] = (uchar)(uVar64 / 5);
        }
        break;
      default:
        uVar64 = 0;
        for (uVar77 = 0; uVar69 != uVar77; uVar77 = uVar77 + 1) {
          bVar95 = puVar52[uVar77];
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar77 & 7));
          *(byte *)((long)&b.data + (ulong)(uVar46 + (uint)uVar77 & 7)) = bVar95;
          uVar60 = (int)uVar64 + ((uint)bVar95 - (uint)bVar9);
          uVar64 = (ulong)uVar60;
          puVar52[uVar77] = (uchar)(uVar60 / uVar46);
        }
      }
      for (; uVar90 < (uVar85 & 0xffff); uVar90 = uVar90 + 1) {
        if (*puVar78 != '\0') {
          __assert_fail("pixels[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                        ,0xf21,
                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar60 = (int)uVar64 - (uint)*(byte *)((long)&b.data + (ulong)((uint)uVar90 & 7));
        uVar64 = (ulong)uVar60;
        *puVar78 = (uchar)(uVar60 / uVar46);
        puVar78 = puVar78 + 1;
      }
      puVar52 = puVar52 + local_438;
      puVar75 = puVar75 + local_438;
    }
    uVar71 = *(uint *)(local_358 + 8);
    uVar85 = *(uint *)(local_358 + 4);
  }
  uVar46 = local_3a8.v_oversample;
  uVar69 = (ulong)local_3a8.v_oversample;
  if (1 < uVar69) {
    lVar49 = (long)local_3a8.stride_in_bytes;
    lVar89 = (long)(int)((uVar71 >> 0x10) * local_3a8.stride_in_bytes);
    pbVar87 = local_3a8.pixels + lVar89 + (ulong)(ushort)uVar71;
    local_468._0_4_ = uVar85 & 0xffff;
    uVar59 = (ushort)(uVar85 >> 0x10);
    b.data._0_4_ = 0;
    b.data._4_4_ = 0;
    iVar68 = uVar59 - local_3a8.v_oversample;
    if (iVar68 < 0) {
      iVar68 = -1;
    }
    uVar90 = (long)iVar68 + 1;
    puVar52 = local_3a8.pixels + uVar90 * lVar49 + lVar89 + (ulong)(ushort)uVar71;
    iVar68 = 0;
    while (iVar68 != local_468._0_4_) {
      local_438 = CONCAT44(local_438._4_4_,iVar68);
      memset(&b,0,uVar69);
      puVar75 = puVar52;
      uVar64 = uVar90;
      switch(uVar46) {
      case 2:
        uVar77 = 0;
        pbVar82 = pbVar87;
        for (uVar79 = 0; uVar90 != uVar79; uVar79 = uVar79 + 1) {
          bVar95 = *pbVar82;
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar79 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar79 + 2 & 7)) = bVar95;
          uVar71 = (int)uVar77 + ((uint)bVar95 - (uint)bVar9);
          uVar77 = (ulong)uVar71;
          *pbVar82 = (byte)(uVar71 >> 1);
          pbVar82 = pbVar82 + lVar49;
        }
        break;
      case 3:
        uVar77 = 0;
        pbVar82 = pbVar87;
        for (uVar79 = 0; uVar90 != uVar79; uVar79 = uVar79 + 1) {
          bVar95 = *pbVar82;
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar79 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar79 + 3 & 7)) = bVar95;
          uVar77 = (ulong)((int)uVar77 + ((uint)bVar95 - (uint)bVar9));
          *pbVar82 = (byte)(uVar77 / 3);
          pbVar82 = pbVar82 + lVar49;
        }
        break;
      case 4:
        uVar77 = 0;
        pbVar82 = pbVar87;
        for (uVar79 = 0; uVar90 != uVar79; uVar79 = uVar79 + 1) {
          bVar95 = *pbVar82;
          uVar81 = (ulong)((uint)uVar79 & 7);
          bVar9 = *(byte *)((long)&b.data + uVar81);
          *(byte *)((long)&b.data + (uVar81 ^ 4)) = bVar95;
          uVar71 = (int)uVar77 + ((uint)bVar95 - (uint)bVar9);
          uVar77 = (ulong)uVar71;
          *pbVar82 = (byte)(uVar71 >> 2);
          pbVar82 = pbVar82 + lVar49;
        }
        break;
      case 5:
        uVar77 = 0;
        pbVar82 = pbVar87;
        for (uVar79 = 0; uVar90 != uVar79; uVar79 = uVar79 + 1) {
          bVar95 = *pbVar82;
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar79 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar79 + 5 & 7)) = bVar95;
          uVar77 = (ulong)((int)uVar77 + ((uint)bVar95 - (uint)bVar9));
          *pbVar82 = (byte)(uVar77 / 5);
          pbVar82 = pbVar82 + lVar49;
        }
        break;
      default:
        uVar77 = 0;
        pbVar82 = pbVar87;
        for (uVar79 = 0; uVar90 != uVar79; uVar79 = uVar79 + 1) {
          bVar95 = *pbVar82;
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar79 & 7));
          *(byte *)((long)&b.data + (ulong)(uVar46 + (uint)uVar79 & 7)) = bVar95;
          uVar71 = (int)uVar77 + ((uint)bVar95 - (uint)bVar9);
          uVar77 = (ulong)uVar71;
          *pbVar82 = (byte)(uVar71 / uVar46);
          pbVar82 = pbVar82 + lVar49;
        }
      }
      for (; uVar64 < uVar59; uVar64 = uVar64 + 1) {
        if (*puVar75 != '\0') {
          __assert_fail("pixels[i*stride_in_bytes] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                        ,0xf5f,
                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar71 = (int)uVar77 - (uint)*(byte *)((long)&b.data + (ulong)((uint)uVar64 & 7));
        uVar77 = (ulong)uVar71;
        *puVar75 = (uchar)(uVar71 / uVar46);
        puVar75 = puVar75 + lVar49;
      }
      pbVar87 = pbVar87 + 1;
      puVar52 = puVar52 + 1;
      iVar68 = (int)(float)local_438 + 1;
    }
    uVar71 = *(uint *)(local_358 + 8);
    uVar85 = *(uint *)(local_358 + 4);
  }
  *local_278 = uVar71;
  uVar59 = (ushort)(uVar85 >> 0x10);
  local_278[1] = CONCAT22((short)(uVar71 >> 0x10) + uVar59,(short)uVar71 + (short)uVar85);
  local_278[4] = (uint)((float)(int)(short)((short)(local_334 << 8) + (short)local_338) * local_2d8)
  ;
  *(ulong *)(local_278 + 2) =
       CONCAT44((float)y0_1 * local_258._4_4_ + local_248._4_4_,
                (float)x0_1 * local_258._0_4_ + local_248._0_4_);
  local_278[5] = (uint)((float)(int)((uVar85 & 0xffff) + x0_1) * local_258._0_4_ + local_248._0_4_);
  local_278[6] = (uint)((float)(int)((uint)uVar59 + y0_1) * local_258._4_4_ + local_248._4_4_);
  lVar65 = local_2f0;
  lVar49 = local_308;
  lVar86 = local_2f8;
  lVar89 = local_2e8;
  auVar101 = local_248;
LAB_00186ab2:
  lVar89 = lVar89 + 1;
  lVar65 = lVar65 + 1;
  goto LAB_00185593;
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildRegisterDefaultCustomRects(atlas);

    atlas->TexID = NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Count glyphs/ranges
    int total_glyphs_count = 0;
    int total_ranges_count = 0;
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = atlas->GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2, total_ranges_count++)
            total_glyphs_count += (in_range[1] - in_range[0]) + 1;
    }

    // We need a width for the skyline algorithm. Using a dumb heuristic here to decide of width. User can override TexDesiredWidth and TexGlyphPadding if they wish.
    // Width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    atlas->TexWidth = (atlas->TexDesiredWidth > 0) ? atlas->TexDesiredWidth : (total_glyphs_count > 4000) ? 4096 : (total_glyphs_count > 2000) ? 2048 : (total_glyphs_count > 1000) ? 1024 : 512;
    atlas->TexHeight = 0;

    // Start packing
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc = {};
    if (!stbtt_PackBegin(&spc, NULL, atlas->TexWidth, max_tex_height, 0, atlas->TexGlyphPadding, NULL))
        return false;
    stbtt_PackSetOversampling(&spc, 1, 1);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // Initialize font information (so we can error without any cleanup)
    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        int                 RectsCount;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)atlas->ConfigData.Size * sizeof(ImFontTempBuildData));
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
        {
            atlas->TexWidth = atlas->TexHeight = 0; // Reset output on failure
            ImGui::MemFree(tmp_array);
            return false;
        }
    }

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyphs_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyphs_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_ranges_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyphs_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyphs_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_ranges_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int font_glyphs_count = 0;
        int font_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2, font_ranges_count++)
            font_glyphs_count += (in_range[1] - in_range[0]) + 1;
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = font_ranges_count;
        buf_ranges_n += font_ranges_count;
        for (int i = 0; i < font_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Pack
        tmp.Rects = buf_rects + buf_rects_n;
        tmp.RectsCount = font_glyphs_count;
        buf_rects_n += font_glyphs_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        IM_ASSERT(n == font_glyphs_count);
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        for (int i = 0; i < n; i++)
            if (tmp.Rects[i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
    }
    IM_ASSERT(buf_rects_n == total_glyphs_count);
    IM_ASSERT(buf_packedchars_n == total_glyphs_count);
    IM_ASSERT(buf_ranges_n == total_ranges_count);

    // Create texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // Second pass: render font characters
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            for (const stbrp_rect* r = tmp.Rects; r != tmp.Rects + tmp.RectsCount; r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, spc.pixels, r->x, r->y, r->w, r->h, spc.stride_in_bytes);
        }
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)
        if (cfg.MergeMode)
            dst_font->BuildLookupTable();

        const float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float off_x = cfg.GlyphOffset.x;
        const float off_y = cfg.GlyphOffset.y + (float)(int)(dst_font->Ascent + 0.5f);

        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyphNoFallback((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, atlas->TexWidth, atlas->TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);
                dst_font->AddGlyph((ImWchar)codepoint, q.x0 + off_x, q.y0 + off_y, q.x1 + off_x, q.y1 + off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
            }
        }
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    ImFontAtlasBuildFinish(atlas);

    return true;
}